

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O1

Result * CoreML::validatePooling3dPadding
                   (Result *__return_storage_ptr__,
                   Pooling3DLayerParams_Pooling3DPaddingType paddingType,int padding,
                   string *paddingName)

{
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  Pooling3DLayerParams_Pooling3DPaddingType __val;
  uint uVar9;
  uint uVar10;
  string err;
  string __str;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (paddingType == Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
    if (-1 < padding) goto LAB_0037a7a8;
    std::operator+(&local_d0,"Custom Padding ",paddingName);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
    puVar6 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar6) {
      local_e0 = *puVar6;
      lStack_d8 = plVar2[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *puVar6;
      local_f0 = (ulong *)*plVar2;
    }
    local_e8 = plVar2[1];
    *plVar2 = (long)puVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    uVar9 = -padding;
    uVar10 = 1;
    if (9 < uVar9) {
      uVar5 = uVar9;
      uVar4 = 4;
      do {
        uVar10 = uVar4;
        if (uVar5 < 100) {
          uVar10 = uVar10 - 2;
          goto LAB_0037ad00;
        }
        if (uVar5 < 1000) {
          uVar10 = uVar10 - 1;
          goto LAB_0037ad00;
        }
        if (uVar5 < 10000) goto LAB_0037ad00;
        bVar1 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar4 = uVar10 + 4;
      } while (bVar1);
      uVar10 = uVar10 + 1;
    }
LAB_0037ad00:
    local_130 = &local_120;
    std::__cxx11::string::_M_construct((ulong)&local_130,(char)uVar10 + '\x01');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)((long)local_130 + 1),uVar10,uVar9);
    uVar8 = 0xf;
    if (local_f0 != &local_e0) {
      uVar8 = local_e0;
    }
    if (uVar8 < (ulong)(local_128 + local_e8)) {
      uVar8 = 0xf;
      if (local_130 != &local_120) {
        uVar8 = local_120;
      }
      if (uVar8 < (ulong)(local_128 + local_e8)) goto LAB_0037ad6c;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_f0);
    }
    else {
LAB_0037ad6c:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_130);
    }
    local_110 = &local_100;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_100 = *plVar2;
      uStack_f8 = puVar3[3];
    }
    else {
      local_100 = *plVar2;
      local_110 = (long *)*puVar3;
    }
    local_108 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar7 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0.field_2._8_8_ = plVar2[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar7;
      local_b0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_b0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_b0);
    goto LAB_0037aeae;
  }
  if (padding == 0) {
LAB_0037a7a8:
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::operator+(&local_50,"Custom Padding ",paddingName);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_120 = *puVar6;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar6;
    local_130 = (ulong *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  uVar10 = -padding;
  if (0 < padding) {
    uVar10 = padding;
  }
  uVar9 = 1;
  if (9 < uVar10) {
    uVar8 = (ulong)uVar10;
    uVar5 = 4;
    do {
      uVar9 = uVar5;
      uVar4 = (uint)uVar8;
      if (uVar4 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_0037a916;
      }
      if (uVar4 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_0037a916;
      }
      if (uVar4 < 10000) goto LAB_0037a916;
      uVar8 = uVar8 / 10000;
      uVar5 = uVar9 + 4;
    } while (99999 < uVar4);
    uVar9 = uVar9 + 1;
  }
LAB_0037a916:
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar9 - (char)(padding >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)padding >> 0x1f) + (long)local_90),uVar9,uVar10);
  uVar8 = 0xf;
  if (local_130 != &local_120) {
    uVar8 = local_120;
  }
  if (uVar8 < (ulong)(local_88 + local_128)) {
    uVar8 = 0xf;
    if (local_90 != local_80) {
      uVar8 = local_80[0];
    }
    if (uVar8 < (ulong)(local_88 + local_128)) goto LAB_0037a99f;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0037a99f:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_90);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar7 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_d0.field_2._M_allocated_capacity = *psVar7;
    local_d0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar7;
    local_d0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_d0._M_string_length = puVar3[1];
  *puVar3 = psVar7;
  puVar3[1] = 0;
  *(undefined1 *)psVar7 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_e0 = *puVar6;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar6;
    local_f0 = (ulong *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __val = -paddingType;
  if (Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM < paddingType) {
    __val = paddingType;
  }
  uVar10 = 1;
  if (9 < (uint)__val) {
    uVar8 = (ulong)(uint)__val;
    uVar9 = 4;
    do {
      uVar10 = uVar9;
      uVar5 = (uint)uVar8;
      if (uVar5 < 100) {
        uVar10 = uVar10 - 2;
        goto LAB_0037aac1;
      }
      if (uVar5 < 1000) {
        uVar10 = uVar10 - 1;
        goto LAB_0037aac1;
      }
      if (uVar5 < 10000) goto LAB_0037aac1;
      uVar8 = uVar8 / 10000;
      uVar9 = uVar10 + 4;
    } while (99999 < uVar5);
    uVar10 = uVar10 + 1;
  }
LAB_0037aac1:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar10 - (char)(paddingType >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)paddingType >> 0x1f) + (long)local_70),uVar10,__val);
  uVar8 = 0xf;
  if (local_f0 != &local_e0) {
    uVar8 = local_e0;
  }
  if (uVar8 < (ulong)(local_68 + local_e8)) {
    uVar8 = 0xf;
    if (local_70 != local_60) {
      uVar8 = local_60[0];
    }
    if (uVar8 < (ulong)(local_68 + local_e8)) goto LAB_0037ab42;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_f0);
  }
  else {
LAB_0037ab42:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70);
  }
  local_110 = &local_100;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_100 = *plVar2;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *plVar2;
    local_110 = (long *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar7 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0.field_2._8_8_ = plVar2[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar7;
    local_b0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar7;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_b0);
LAB_0037aeae:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validatePooling3dPadding(const Specification::Pooling3DLayerParams_Pooling3DPaddingType paddingType,
                              const int padding, const std::string& paddingName) {
    if (paddingType == Specification::Pooling3DLayerParams_Pooling3DPaddingType_CUSTOM) {
        if (padding < 0) {
            std::string err = "Custom Padding " + paddingName + " must be non-negative, got " + std::to_string(padding) + ".";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    } else {
        if (padding != 0) {
            std::string err = "Custom Padding " + paddingName + " cannot be non-zero (got " + std::to_string(padding)
            + ") unless padding type is CUSTOM (got " + std::to_string(paddingType) + ").";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    Result r;
    return r;
}